

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O0

Pass * wasm::createDiscardGlobalEffectsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  DiscardGlobalEffects::DiscardGlobalEffects((DiscardGlobalEffects *)this);
  return this;
}

Assistant:

Pass* createDiscardGlobalEffectsPass() { return new DiscardGlobalEffects(); }